

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

Integer pnga_sprs_array_create_from_sparse(Integer s_a,Integer trans)

{
  long lVar1;
  size_t __size;
  size_t __n;
  Integer IVar2;
  _sparse_array *p_Var3;
  Integer IVar4;
  Integer *pIVar5;
  logical lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  Integer IVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  Integer lo [2];
  Integer ld;
  char plus [2];
  void *g_data;
  void *jptr;
  void *iptr;
  void *s_data;
  Integer jhi;
  Integer jlo;
  Integer nblock [2];
  Integer dims [2];
  Integer local_118;
  long local_110;
  Integer *local_108;
  Integer local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  int local_e0;
  char local_da [2];
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  Integer local_b0;
  long local_a8;
  Integer local_a0;
  long local_98;
  long local_90;
  Integer local_88;
  Integer *local_80;
  long local_78;
  Integer local_70;
  Integer local_68;
  Integer local_60;
  Integer local_58;
  Integer local_50;
  Integer local_48;
  Integer local_40;
  
  lVar1 = s_a + 1000;
  local_100 = trans;
  local_a0 = s_a;
  IVar4 = pnga_pgroup_nnodes(SPA[lVar1].grp);
  local_108 = (Integer *)pnga_pgroup_nodeid(SPA[lVar1].grp);
  local_88 = SPA[lVar1].idx_size;
  __n = SPA[lVar1].size;
  bVar15 = _ga_sync_begin != 0;
  local_e0 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar15) {
    pnga_pgroup_sync(SPA[lVar1].grp);
  }
  local_f8 = IVar4 + 1;
  __size = IVar4 * 8 + 8;
  pIVar5 = (Integer *)malloc(__size);
  if (-1 < IVar4) {
    memset(pIVar5,0,__size);
  }
  p_Var3 = SPA;
  pIVar5[(long)local_108 + 1] = SPA[lVar1].ilo + 1;
  local_da[0] = '+';
  local_da[1] = '\0';
  pnga_pgroup_gop(p_Var3[lVar1].grp,0x3ea,pIVar5,local_f8,local_da);
  lVar14 = 0;
  if (local_100 == 0) {
    lVar14 = IVar4;
  }
  pIVar5[lVar14] = 1;
  IVar11 = IVar4;
  IVar2 = 1;
  if (local_100 == 0) {
    IVar11 = 1;
    IVar2 = IVar4;
  }
  IVar4 = pnga_create_handle();
  local_48 = SPA[lVar1].idim;
  local_40 = SPA[lVar1].jdim;
  local_108 = pIVar5;
  pnga_set_data(IVar4,2,&local_48,SPA[lVar1].type);
  pIVar5 = local_108;
  local_58 = IVar2;
  local_50 = IVar11;
  pnga_set_irreg_distr(IVar4,local_108,&local_58);
  lVar6 = pnga_allocate(IVar4);
  if (lVar6 == 0) {
    pnga_error("(ga_sprs_array_create_from_sparse) failed to create dense array",0);
  }
  free(pIVar5);
  pnga_zero(IVar4);
  lVar14 = SPA[lVar1].ilo;
  local_d8 = SPA[lVar1].ihi;
  if (local_100 == 0) {
    local_118 = lVar14 + 1;
    local_c8 = local_d8 + 1;
    local_110 = 1;
    local_c0 = SPA[lVar1].jdim;
  }
  else {
    local_118 = 1;
    local_c8 = SPA[lVar1].idim;
    local_110 = lVar14 + 1;
    local_c0 = local_d8 + 1;
  }
  local_b0 = IVar4;
  pnga_access_ptr(IVar4,&local_118,&local_c8,&local_d0,&local_f0);
  lVar13 = lVar1 * 200;
  if (0 < SPA[lVar1].nblocks) {
    lVar7 = 0;
    local_a8 = lVar1 * 200;
    local_90 = lVar14;
    do {
      IVar2 = local_a0;
      IVar4 = *(Integer *)(*(long *)((long)&SPA->blkidx + local_a8) + lVar7 * 8);
      local_98 = lVar7;
      pnga_sprs_array_column_distribution(local_a0,IVar4,&local_60,&local_68);
      pnga_sprs_array_access_col_block(IVar2,IVar4,&local_78,&local_80,&local_70);
      lVar1 = local_78;
      if (lVar14 <= local_d8) {
        local_108 = local_80;
        local_f8 = local_70;
        lVar13 = lVar14;
        do {
          lVar14 = lVar13 - lVar14;
          local_e8 = lVar13;
          if (local_88 == 4) {
            lVar7 = (long)*(int *)(lVar1 + 4 + lVar14 * 4) - (long)*(int *)(lVar1 + lVar14 * 4);
            if (0 < (int)lVar7) {
              lVar12 = 0;
              do {
                lVar8 = *(int *)(lVar1 + lVar14 * 4) + lVar12;
                lVar9 = (long)*(int *)((long)local_108 + lVar8 * 4);
                if (local_100 == 0) {
                  lVar9 = ((lVar9 - local_110) + 1) * local_f0 + ((lVar13 + 1) - local_118);
                }
                else {
                  lVar9 = ((lVar9 + ((lVar13 + 1) - local_110) * local_f0) - local_118) + 1;
                }
                memcpy((void *)(lVar9 * __n + local_d0),(void *)(lVar8 * __n + local_f8),__n);
                lVar12 = lVar12 + 1;
              } while (lVar7 != lVar12);
            }
          }
          else {
            lVar7 = *(long *)(lVar1 + 8 + lVar14 * 8);
            lVar12 = *(long *)(lVar1 + lVar14 * 8);
            if (lVar12 < lVar7) {
              lVar8 = 0;
              do {
                lVar9 = *(long *)(lVar1 + lVar14 * 8) + lVar8;
                if (local_100 == 0) {
                  lVar10 = ((local_108[lVar9] - local_110) + 1) * local_f0 +
                           ((lVar13 + 1) - local_118);
                }
                else {
                  lVar10 = ((local_108[lVar9] + ((lVar13 + 1) - local_110) * local_f0) - local_118)
                           + 1;
                }
                memcpy((void *)(lVar10 * __n + local_d0),(void *)(lVar9 * __n + local_f8),__n);
                lVar8 = lVar8 + 1;
              } while (lVar7 - lVar12 != lVar8);
            }
          }
          lVar13 = local_e8 + 1;
          lVar14 = local_90;
        } while (local_e8 != local_d8);
      }
      lVar7 = local_98 + 1;
      lVar13 = local_a8;
    } while (lVar7 < *(long *)((long)&SPA->nblocks + local_a8));
  }
  IVar4 = local_b0;
  pnga_release(local_b0,&local_118,&local_c8);
  if (local_e0 != 0) {
    pnga_pgroup_sync(*(Integer *)((long)&SPA->grp + lVar13));
  }
  return IVar4;
}

Assistant:

Integer pnga_sprs_array_create_from_sparse(Integer s_a,
    Integer trans)
{
  Integer *map;
  Integer handle = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer nprocs = pnga_pgroup_nnodes(SPA[handle].grp);
  Integer me = pnga_pgroup_nodeid(SPA[handle].grp);
  Integer g_a;
  Integer dims[2];
  Integer two = 2;
  Integer nblock[2];
  Integer idx_size = SPA[handle].idx_size;
  Integer ilo, ihi;
  Integer lo[2], hi[2], ld;
  Integer i, j, iblock;
  Integer elemsize = SPA[handle].size;
  void *g_data;
  void *s_data;
  char plus[2];

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(SPA[handle].grp);

  /* allocate and fill map array to create new GA */
  map = (Integer*)malloc((nprocs+1)*sizeof(Integer));
  for (i=0; i<nprocs+1; i++) map[i] = 0;
  if (trans) {
    map[me+1] = SPA[handle].ilo+1;
  } else {
    map[me+1] = SPA[handle].ilo+1;
  }
  plus[0] = '+';
  plus[1] = '\0';
  if (sizeof(Integer) == 4) {
    pnga_pgroup_gop(SPA[handle].grp, C_INT, map, nprocs+1, plus);
  } else {
    pnga_pgroup_gop(SPA[handle].grp, C_LONG, map, nprocs+1, plus);
  }
  if (trans) {
    map[0] = 1;
  } else {
    map[nprocs] = 1;
  }
  g_a = pnga_create_handle();
  dims[0] = SPA[handle].idim;
  dims[1] = SPA[handle].jdim;
  pnga_set_data(g_a,two,dims,SPA[handle].type);
  if (trans) {
    nblock[0] = 1;
    nblock[1] = nprocs;
  } else {
    nblock[0] = nprocs;
    nblock[1] = 1;
  }
  pnga_set_irreg_distr(g_a, map, nblock);
  if (!pnga_allocate(g_a)) {
    pnga_error("(ga_sprs_array_create_from_sparse) failed to create"
        " dense array",0);
  }
  free(map);
  /* Initialize global array to zero */
  pnga_zero(g_a);
  /* get limits of locally held row block */
  ilo = SPA[handle].ilo;
  ihi = SPA[handle].ihi;
  if (trans) {
    lo[0] = 1;
    hi[0] = SPA[handle].idim;
    lo[1] = ilo+1;
    hi[1] = ihi+1;
  } else {
    lo[0] = ilo+1;
    hi[0] = ihi+1;
    lo[1] = 1;
    hi[1] = SPA[handle].jdim;
  }
  pnga_access_ptr(g_a,lo,hi,&g_data,&ld);
  /* loop over all column blocks in row block and assign values to dense matrix */
  for (iblock=0; iblock<SPA[handle].nblocks; iblock++) {
    void *iptr, *jptr;
    int64_t *lidx, *ljdx;
    int *sidx, *sjdx;
    Integer idx, jdx, n;
    Integer jlo, jhi;
    n = SPA[handle].blkidx[iblock];
    pnga_sprs_array_column_distribution(s_a,n,&jlo,&jhi);
    pnga_sprs_array_access_col_block(s_a,n,&iptr,&jptr,&s_data);
    for (i=ilo; i<=ihi; i++) {
      Integer ncols;
      if (idx_size == 4) {
        sidx = (int*)iptr;
        sjdx = (int*)jptr;
        ncols =  (Integer)(sidx[i+1-ilo]-sidx[i-ilo]);
        for (j=0; j<ncols; j++) {
          jdx = sjdx[sidx[i-ilo]+j];
          if (trans) {
            memcpy(((char*)g_data+elemsize*((i-lo[1]+1)*ld+jdx-lo[0]+1)),
                ((char*)s_data+elemsize*(sidx[i-ilo]+j)),
                (size_t)elemsize);
          }  else {
            memcpy(((char*)g_data+elemsize*(i-lo[0]+1+ld*(jdx-lo[1]+1))),
                ((char*)s_data+elemsize*(sidx[i-ilo]+j)),
                (size_t)elemsize);
          }
        }
      } else {
        lidx = (int64_t*)iptr;
        ljdx = (int64_t*)jptr;
        ncols =  (Integer)(lidx[i+1-ilo]-lidx[i-ilo]);
        for (j=0; j<ncols; j++) {
          jdx = ljdx[lidx[i-ilo]+j];
          if (trans) {
            memcpy(((char*)g_data+elemsize*((i-lo[1]+1)*ld+jdx-lo[0]+1)),
                ((char*)s_data+elemsize*(lidx[i-ilo]+j)),
                (size_t)elemsize);
          }  else {
            memcpy(((char*)g_data+elemsize*(i-lo[0]+1+ld*(jdx-lo[1]+1))),
                ((char*)s_data+elemsize*(lidx[i-ilo]+j)),
                (size_t)elemsize);
          }
        }
      }
    }
  }
  pnga_release(g_a,lo,hi); 
  if (local_sync_end) pnga_pgroup_sync(SPA[handle].grp);
  return g_a;
}